

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O2

int __thiscall arbiter::Arbiter::copy(Arbiter *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  ArbiterError *pAVar4;
  bool in_CL;
  char *__rhs;
  string *this_00;
  int iVar5;
  pointer pbVar6;
  string srcToResolve;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  Endpoint dstEndpoint;
  string subpath;
  Endpoint local_258;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string commonPrefix;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (*(long *)(dst + 8) == 0) {
    pAVar4 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_b0,"Cannot copy from empty source",(allocator *)&local_258);
    ArbiterError::ArbiterError(pAVar4,&local_b0);
    __cxa_throw(pAVar4,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(long *)(src + 8) != 0) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)dst);
    bVar1 = isDirectory(&local_50);
    __rhs = "";
    if (bVar1) {
      __rhs = "**";
    }
    ::std::operator+(&srcToResolve,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst,__rhs)
    ;
    ::std::__cxx11::string::~string((string *)&local_50);
    if (srcToResolve._M_dataplus._M_p[srcToResolve._M_string_length - 1] == '*') {
      ::std::__cxx11::string::string((string *)&local_190,(string *)dst);
      stripPostfixing(&local_170,&local_190);
      getEndpoint(&local_258,this,&local_170);
      ::std::__cxx11::string::~string((string *)&local_170);
      ::std::__cxx11::string::~string((string *)&local_190);
      Endpoint::prefixedRoot_abi_cxx11_(&commonPrefix,&local_258);
      ::std::__cxx11::string::string((string *)&local_1d0,(string *)src);
      getEndpoint(&dstEndpoint,this,&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      Endpoint::prefixedRoot_abi_cxx11_(&subpath,&local_258);
      Endpoint::prefixedRoot_abi_cxx11_(&local_230,&dstEndpoint);
      _Var2 = ::std::operator==(&subpath,&local_230);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::__cxx11::string::~string((string *)&subpath);
      if (_Var2) {
        pAVar4 = (ArbiterError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_f0,"Cannot copy directory to itself",(allocator *)&subpath);
        ArbiterError::ArbiterError(pAVar4,&local_f0);
        __cxa_throw(pAVar4,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string((string *)&local_1f0,(string *)&srcToResolve);
      resolve(&paths,this,&local_1f0,in_CL);
      ::std::__cxx11::string::~string((string *)&local_1f0);
      iVar5 = 0;
      for (pbVar6 = paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        ::std::__cxx11::string::substr((ulong)&subpath,(ulong)pbVar6);
        if (in_CL != false) {
          iVar5 = iVar5 + 1;
          poVar3 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,iVar5);
          poVar3 = ::std::operator<<(poVar3," / ");
          poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = ::std::operator<<(poVar3,": ");
          poVar3 = ::std::operator<<(poVar3,(string *)pbVar6);
          poVar3 = ::std::operator<<(poVar3," -> ");
          Endpoint::prefixedFullPath(&local_230,&dstEndpoint,&subpath);
          poVar3 = ::std::operator<<(poVar3,(string *)&local_230);
          ::std::endl<char,std::char_traits<char>>(poVar3);
          ::std::__cxx11::string::~string((string *)&local_230);
        }
        bVar1 = Endpoint::isLocal(&dstEndpoint);
        if (bVar1) {
          Endpoint::fullPath(&local_210,&dstEndpoint,&subpath);
          getDirname(&local_70,&local_210);
          mkdirp(&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_210);
        }
        ::std::__cxx11::string::string((string *)&local_110,(string *)&subpath);
        ::std::__cxx11::string::string((string *)&local_90,(string *)pbVar6);
        getBinary((vector<char,_std::allocator<char>_> *)&local_230,this,&local_90);
        Endpoint::put(&dstEndpoint,&local_110,(vector<char,_std::allocator<char>_> *)&local_230);
        ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_230);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_110);
        ::std::__cxx11::string::~string((string *)&subpath);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&paths);
      ::std::__cxx11::string::~string((string *)&dstEndpoint.m_root);
      ::std::__cxx11::string::~string((string *)&commonPrefix);
      this_00 = &local_258.m_root;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_130,(string *)dst);
      ::std::__cxx11::string::string((string *)&local_150,(string *)src);
      copyFile(this,&local_130,&local_150,in_CL);
      ::std::__cxx11::string::~string((string *)&local_150);
      this_00 = &local_130;
    }
    ::std::__cxx11::string::~string((string *)this_00);
    iVar5 = ::std::__cxx11::string::~string((string *)&srcToResolve);
    return iVar5;
  }
  pAVar4 = (ArbiterError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_d0,"Cannot copy to empty destination",(allocator *)&local_258);
  ArbiterError::ArbiterError(pAVar4,&local_d0);
  __cxa_throw(pAVar4,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Arbiter::copy(
        const std::string src,
        const std::string dst,
        const bool verbose) const
{
    if (src.empty()) throw ArbiterError("Cannot copy from empty source");
    if (dst.empty()) throw ArbiterError("Cannot copy to empty destination");

    // Globify the source path if it's a directory.  In this case, the source
    // already ends with a slash.
    const std::string srcToResolve(src + (isDirectory(src) ? "**" : ""));

    if (srcToResolve.back() != '*')
    {
        // The source is a single file.
        copyFile(src, dst, verbose);
    }
    else
    {
        // We'll need this to mirror the directory structure in the output.
        // All resolved paths will contain this common prefix, so we can
        // determine any nested paths from recursive resolutions by stripping
        // that common portion.
        const Endpoint& srcEndpoint(getEndpoint(stripPostfixing(src)));
        const std::string commonPrefix(srcEndpoint.prefixedRoot());

        const Endpoint dstEndpoint(getEndpoint(dst));

        if (srcEndpoint.prefixedRoot() == dstEndpoint.prefixedRoot())
        {
            throw ArbiterError("Cannot copy directory to itself");
        }

        int i(0);
        const auto paths(resolve(srcToResolve, verbose));

        for (const auto& path : paths)
        {
            const std::string subpath(path.substr(commonPrefix.size()));

            if (verbose)
            {
                std::cout <<
                    ++i << " / " << paths.size() << ": " <<
                    path << " -> " << dstEndpoint.prefixedFullPath(subpath) <<
                    std::endl;
            }

            if (dstEndpoint.isLocal())
            {
                mkdirp(getDirname(dstEndpoint.fullPath(subpath)));
            }

            dstEndpoint.put(subpath, getBinary(path));
        }
    }
}